

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O0

int TIFFFlushData1(TIFF *tif)

{
  int iVar1;
  uint32_t local_24;
  TIFF *tif_local;
  
  if ((0 < tif->tif_rawcc) && ((tif->tif_flags & 0x100000) != 0)) {
    if (((tif->tif_flags & (uint)(tif->tif_dir).td_fillorder) == 0) &&
       ((tif->tif_flags & 0x100) == 0)) {
      TIFFReverseBits(tif->tif_rawdata,tif->tif_rawcc);
    }
    if ((tif->tif_flags & 0x400) == 0) {
      local_24 = tif->tif_curstrip;
    }
    else {
      local_24 = tif->tif_curtile;
    }
    iVar1 = TIFFAppendToStrip(tif,local_24,tif->tif_rawdata,tif->tif_rawcc);
    if (iVar1 == 0) {
      tif->tif_rawcc = 0;
      tif->tif_rawcp = tif->tif_rawdata;
      return 0;
    }
    tif->tif_rawcc = 0;
    tif->tif_rawcp = tif->tif_rawdata;
  }
  return 1;
}

Assistant:

int TIFFFlushData1(TIFF *tif)
{
    if (tif->tif_rawcc > 0 && tif->tif_flags & TIFF_BUF4WRITE)
    {
        if (!isFillOrder(tif, tif->tif_dir.td_fillorder) &&
            (tif->tif_flags & TIFF_NOBITREV) == 0)
            TIFFReverseBits((uint8_t *)tif->tif_rawdata, tif->tif_rawcc);
        if (!TIFFAppendToStrip(
                tif, isTiled(tif) ? tif->tif_curtile : tif->tif_curstrip,
                tif->tif_rawdata, tif->tif_rawcc))
        {
            /* We update those variables even in case of error since there's */
            /* code that doesn't really check the return code of this */
            /* function */
            tif->tif_rawcc = 0;
            tif->tif_rawcp = tif->tif_rawdata;
            return (0);
        }
        tif->tif_rawcc = 0;
        tif->tif_rawcp = tif->tif_rawdata;
    }
    return (1);
}